

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O2

char get_next_file(int imageno,dircnt_t *dirptr,img_fol_t *img_fol,
                  opj_decompress_parameters *parameters)

{
  int iVar1;
  char *pcVar2;
  char *src;
  char *src_00;
  char cVar3;
  char temp1 [4096];
  char temp_ofname [4096];
  char infilename [4096];
  char image_filename [4096];
  char outfilename [4096];
  char local_5038 [4096];
  char local_4038 [4096];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  memset(local_5038,0,0x1000);
  strcpy(local_2038,dirptr->filename[imageno]);
  fprintf(_stderr,"File Number %d \"%s\"\n",imageno,local_2038);
  sprintf(local_3038,"%s%s%s",img_fol->imgdirpath,path_separator,local_2038);
  iVar1 = infile_format(local_3038);
  parameters->decod_format = iVar1;
  cVar3 = '\x01';
  if ((iVar1 != -1) && (iVar1 = opj_strcpy_s(parameters->infile,(size_t)local_3038,src), iVar1 == 0)
     ) {
    pcVar2 = strtok(local_2038,".");
    strcpy(local_4038,pcVar2);
    while (pcVar2 = strtok((char *)0x0,"."), pcVar2 != (char *)0x0) {
      strcat(local_4038,local_5038);
      sprintf(local_5038,".%s",pcVar2);
    }
    if (img_fol->set_out_format == '\x01') {
      sprintf(local_1038,"%s/%s.%s",img_fol->imgdirpath,local_4038,img_fol->out_format);
      iVar1 = opj_strcpy_s(parameters->outfile,(size_t)local_1038,src_00);
      if (iVar1 != 0) {
        return '\x01';
      }
    }
    cVar3 = '\0';
  }
  return cVar3;
}

Assistant:

char get_next_file(int imageno, dircnt_t *dirptr, img_fol_t *img_fol,
                   opj_decompress_parameters *parameters)
{
    char image_filename[OPJ_PATH_LEN], infilename[OPJ_PATH_LEN],
         outfilename[OPJ_PATH_LEN], temp_ofname[OPJ_PATH_LEN];
    char *temp_p, temp1[OPJ_PATH_LEN] = "";

    strcpy(image_filename, dirptr->filename[imageno]);
    fprintf(stderr, "File Number %d \"%s\"\n", imageno, image_filename);
    sprintf(infilename, "%s%s%s", img_fol->imgdirpath, path_separator,
            image_filename);
    parameters->decod_format = infile_format(infilename);
    if (parameters->decod_format == -1) {
        return 1;
    }
    if (opj_strcpy_s(parameters->infile, sizeof(parameters->infile),
                     infilename) != 0) {
        return 1;
    }

    /*Set output file*/
    strcpy(temp_ofname, strtok(image_filename, "."));
    while ((temp_p = strtok(NULL, ".")) != NULL) {
        strcat(temp_ofname, temp1);
        sprintf(temp1, ".%s", temp_p);
    }
    if (img_fol->set_out_format == 1) {
        sprintf(outfilename, "%s/%s.%s", img_fol->imgdirpath, temp_ofname,
                img_fol->out_format);
        if (opj_strcpy_s(parameters->outfile, sizeof(parameters->outfile),
                         outfilename) != 0) {
            return 1;
        }
    }
    return 0;
}